

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraLcr.c
# Opt level: O1

Aig_Man_t * Fra_LcrCreatePart(Fra_Lcr_t *p,Vec_Int_t *vPart)

{
  int iVar1;
  Vec_Ptr_t *pVVar2;
  void *pvVar3;
  Aig_Man_t *pNew;
  Aig_Obj_t *pAVar4;
  long lVar5;
  
  pNew = Aig_ManStartFrom(p->pAig);
  Aig_ManIncrementTravId(p->pAig);
  pAVar4 = p->pAig->pConst1;
  pAVar4->TravId = p->pAig->nTravIds;
  pAVar4->field_5 = (anon_union_8_3_a781e0d5_for_Aig_Obj_t__13)pNew->pConst1;
  if (0 < vPart->nSize) {
    lVar5 = 0;
    do {
      iVar1 = vPart->pArray[lVar5];
      if ((long)iVar1 < 0) {
LAB_005ff3a5:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      pVVar2 = p->pAig->vCos;
      if (pVVar2->nSize <= iVar1) goto LAB_005ff3a5;
      pvVar3 = pVVar2->pArray[iVar1];
      if ((*(byte *)((long)pvVar3 + 0x18) & 0x10) == 0) {
        pAVar4 = pNew->pConst1;
      }
      else {
        pAVar4 = Fra_LcrCreatePart_rec
                           (p->pCla,pNew,p->pAig,
                            (Aig_Obj_t *)(*(ulong *)((long)pvVar3 + 8) & 0xfffffffffffffffe));
        pAVar4 = (Aig_Obj_t *)((ulong)((uint)*(undefined8 *)((long)pvVar3 + 8) & 1) ^ (ulong)pAVar4)
        ;
      }
      Aig_ObjCreateCo(pNew,pAVar4);
      lVar5 = lVar5 + 1;
    } while (lVar5 < vPart->nSize);
  }
  return pNew;
}

Assistant:

Aig_Man_t * Fra_LcrCreatePart( Fra_Lcr_t * p, Vec_Int_t * vPart )
{
    Aig_Man_t * pNew;
    Aig_Obj_t * pObj, * pObjNew;
    int Out, i;
    // create new AIG for this partition
    pNew = Aig_ManStartFrom( p->pAig );
    Aig_ManIncrementTravId( p->pAig );
    Aig_ObjSetTravIdCurrent( p->pAig, Aig_ManConst1(p->pAig) );
    Aig_ManConst1(p->pAig)->pData = Aig_ManConst1(pNew);
    Vec_IntForEachEntry( vPart, Out, i )
    {
        pObj = Aig_ManCo( p->pAig, Out );
        if ( pObj->fMarkA )
        {
            pObjNew = Fra_LcrCreatePart_rec( p->pCla, pNew, p->pAig, Aig_ObjFanin0(pObj) );
            pObjNew = Aig_NotCond( pObjNew, Aig_ObjFaninC0(pObj) );
        }
        else
            pObjNew = Aig_ManConst1( pNew );
        Aig_ObjCreateCo( pNew, pObjNew ); 
    }
    return pNew;
}